

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O1

pair<helics::GlobalFederateId,_TimeRepresentation<count_time<9,_long>_>_> __thiscall
helics::TimeCoordinator::getMinGrantedDependency(TimeCoordinator *this)

{
  long lVar1;
  ulong uVar2;
  DependencyInfo *dep;
  pointer pDVar3;
  TimeRepresentation<count_time<9,_long>_> TVar4;
  pair<helics::GlobalFederateId,_TimeRepresentation<count_time<9,_long>_>_> pVar5;
  
  TVar4.internalTimeCode = 0x7fffffffffffffff;
  uVar2 = 0x8831d580;
  for (pDVar3 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pDVar3 != (this->super_BaseTimeCoordinator).dependencies.dependencies.
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish; pDVar3 = pDVar3 + 1) {
    if (((pDVar3->dependency == true) && ((pDVar3->super_TimeData).mTimeState != time_requested)) &&
       (lVar1 = (pDVar3->super_TimeData).next.internalTimeCode, lVar1 < TVar4.internalTimeCode)) {
      uVar2 = (ulong)(uint)(pDVar3->fedID).gid;
      TVar4.internalTimeCode = lVar1;
    }
  }
  pVar5.second.internalTimeCode = TVar4.internalTimeCode;
  pVar5._0_8_ = uVar2;
  return pVar5;
}

Assistant:

std::pair<GlobalFederateId, Time> TimeCoordinator::getMinGrantedDependency() const
{
    Time minTime = Time::maxVal();
    GlobalFederateId minID;
    for (const auto& dep : dependencies) {
        if (!dep.dependency) {
            continue;
        }
        if (dep.mTimeState != TimeState::time_requested) {
            if (dep.next < minTime) {
                minTime = dep.next;
                minID = dep.fedID;
            }
        }
    }
    return {minID, minTime};
}